

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
::find_position<HashObject<8,8>>
          (dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
           *this,HashObject<8,_8> *key)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined6 uVar3;
  undefined1 auVar4 [12];
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  short sVar10;
  undefined1 auVar11 [16];
  pair<unsigned_long,_unsigned_long> pVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 uVar14;
  undefined2 uVar15;
  
  g_num_hashes = g_num_hashes + 1;
  uVar1 = *(undefined4 *)key->buffer_;
  uVar14 = (undefined1)((uint)uVar1 >> 0x18);
  uVar15 = CONCAT11(uVar14,uVar14);
  uVar14 = (undefined1)((uint)uVar1 >> 0x10);
  uVar2 = CONCAT35(CONCAT21(uVar15,uVar14),CONCAT14(uVar14,uVar1));
  uVar14 = (undefined1)((uint)uVar1 >> 8);
  uVar3 = CONCAT51(CONCAT41((int)((ulong)uVar2 >> 0x20),uVar14),uVar14);
  sVar10 = CONCAT11((char)uVar1,(char)uVar1);
  uVar5 = CONCAT62(uVar3,sVar10);
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar5;
  auVar13._12_2_ = uVar15;
  auVar13._14_2_ = uVar15;
  uVar15 = (undefined2)((ulong)uVar2 >> 0x20);
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar5;
  auVar12._10_2_ = uVar15;
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._8_2_ = uVar15;
  auVar11._0_8_ = uVar5;
  uVar15 = (undefined2)uVar3;
  auVar4._4_8_ = auVar11._8_8_;
  auVar4._2_2_ = uVar15;
  auVar4._0_2_ = uVar15;
  uVar9 = (long)((auVar12._12_4_ >> 0x18) + (auVar4._0_4_ >> 0x18) +
                (auVar11._8_4_ >> 0x18) + ((int)sVar10 >> 8) + key->i_) &
          *(long *)(this + 0x40) - 1U;
  iVar7 = *(int *)(*(long *)(this + 0x50) + uVar9 * 0xc);
  uVar5 = 0xffffffffffffffff;
  if (*(int *)(this + 0x28) == iVar7) {
    uVar8 = 0xffffffffffffffff;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    lVar6 = 1;
    do {
      if ((*(long *)(this + 0x30) == 0) || (*(int *)(this + 0x20) != iVar7)) {
        if (key->i_ == iVar7) {
          uVar5 = uVar9;
          uVar9 = 0xffffffffffffffff;
          goto LAB_00130d90;
        }
      }
      else if (uVar8 == 0xffffffffffffffff) {
        uVar8 = uVar9;
      }
      uVar9 = uVar9 + lVar6 & *(long *)(this + 0x40) - 1U;
      iVar7 = *(int *)(*(long *)(this + 0x50) + uVar9 * 0xc);
      lVar6 = lVar6 + 1;
    } while (*(int *)(this + 0x28) != iVar7);
  }
  if (uVar8 != 0xffffffffffffffff) {
    uVar9 = uVar8;
  }
LAB_00130d90:
  pVar16.second = uVar9;
  pVar16.first = uVar5;
  return pVar16;
}

Assistant:

size_type bucket_count() const { return num_buckets; }